

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O0

StructType * LLVMBC::StructType::get(LLVMContext *context,Vector<Type_*> *member_types)

{
  value_type pTVar1;
  bool bVar2;
  TypeID TVar3;
  uint uVar4;
  Vector<Type_*> *this;
  reference ppTVar5;
  size_type sVar6;
  reference ppTVar7;
  Type *pTVar8;
  LLVMContext *local_70;
  LLVMContext *local_68;
  StructType *type;
  uint local_58;
  uint i;
  uint count;
  bool equal;
  StructType *struct_type;
  Type *type_1;
  iterator __end1;
  iterator __begin1;
  Vector<Type_*> *__range1;
  Vector<Type_*> *cache;
  Vector<Type_*> *member_types_local;
  LLVMContext *context_local;
  
  this = LLVMContext::get_type_cache(context);
  __end1 = std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::begin(this)
  ;
  type_1 = (Type *)std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::end
                             (this);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<LLVMBC::Type_**,_std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>_>
                                *)&type_1);
    if (!bVar2) {
      local_70 = (LLVMContext *)
                 LLVMContext::
                 construct<LLVMBC::StructType,LLVMBC::LLVMContext&,std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>>
                           (context,context,member_types);
      local_68 = local_70;
      std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::push_back
                (this,(value_type *)&local_70);
      return (StructType *)local_68;
    }
    ppTVar5 = __gnu_cxx::
              __normal_iterator<LLVMBC::Type_**,_std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>_>
              ::operator*(&__end1);
    struct_type = (StructType *)*ppTVar5;
    TVar3 = Type::getTypeID((Type *)struct_type);
    if (TVar3 == StructTyID) {
      _count = cast<LLVMBC::StructType>(&struct_type->super_Type);
      uVar4 = getNumElements(_count);
      sVar6 = std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::size
                        (member_types);
      if (uVar4 == sVar6) {
        i._3_1_ = 1;
        sVar6 = std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::size
                          (member_types);
        local_58 = (uint)sVar6;
        for (type._4_4_ = 0; type._4_4_ < local_58; type._4_4_ = type._4_4_ + 1) {
          ppTVar7 = std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::
                    operator[](member_types,(ulong)type._4_4_);
          pTVar1 = *ppTVar7;
          pTVar8 = getElementType(_count,type._4_4_);
          if (pTVar1 != pTVar8) {
            i._3_1_ = 0;
            break;
          }
        }
        if ((i._3_1_ & 1) != 0) {
          return _count;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<LLVMBC::Type_**,_std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

StructType *StructType::get(LLVMContext &context, Vector<Type *> member_types)
{
	auto &cache = context.get_type_cache();
	for (auto *type : cache)
	{
		if (type->getTypeID() == TypeID::StructTyID)
		{
			auto *struct_type = cast<StructType>(type);
			if (struct_type->getNumElements() == member_types.size())
			{
				bool equal = true;
				unsigned count = member_types.size();
				for (unsigned i = 0; i < count; i++)
				{
					if (member_types[i] != struct_type->getElementType(i))
					{
						equal = false;
						break;
					}
				}

				if (equal)
					return struct_type;
			}
		}
	}

	auto *type = context.construct<StructType>(context, std::move(member_types));
	cache.push_back(type);
	return type;
}